

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O0

bool hasConnectedNodes(Network *nw)

{
  bool bVar1;
  size_type __n;
  reference ppLVar2;
  reference pvVar3;
  NetworkError *this;
  Node *pNVar4;
  ostream *poVar5;
  ENerror *e;
  string local_90 [32];
  int local_70;
  int local_6c;
  int i;
  int unmarkedCount;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link_*,_std::allocator<Link_*>_> *__range1;
  allocator_type local_32;
  value_type local_31;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> marked;
  int nodeCount;
  Network *nw_local;
  
  marked.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = Network::count(nw,NODE);
  __n = (size_type)(int)marked.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
  local_31 = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30,__n,&local_31,&local_32);
  std::allocator<char>::~allocator(&local_32);
  __end1 = std::vector<Link_*,_std::allocator<Link_*>_>::begin(&nw->links);
  link = (Link *)std::vector<Link_*,_std::allocator<Link_*>_>::end(&nw->links);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>
                                     *)&link), bVar1) {
    ppLVar2 = __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
              operator*(&__end1);
    _i = *ppLVar2;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,
                        (long)(_i->fromNode->super_Element).index);
    *pvVar3 = *pvVar3 + '\x01';
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,
                        (long)(_i->toNode->super_Element).index);
    *pvVar3 = *pvVar3 + '\x01';
    __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::operator++
              (&__end1);
  }
  local_6c = 0;
  local_70 = 0;
  while( true ) {
    if ((int)marked.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ <= local_70) {
      if (10 < local_6c) {
        poVar5 = std::operator<<((ostream *)&nw->msgLog,
                                 "\n\n NETWORK ERROR 233: no links connected to another ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_6c + -10);
        std::operator<<(poVar5," nodes ");
      }
      bVar1 = local_6c == 0;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_30);
      return bVar1;
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,(long)local_70);
    if ((*pvVar3 == '\0') && (local_6c = local_6c + 1, local_6c < 0xb)) break;
    local_70 = local_70 + 1;
  }
  this = (NetworkError *)__cxa_allocate_exception(0x30);
  pNVar4 = Network::node(nw,local_70);
  std::__cxx11::string::string(local_90,(string *)&(pNVar4->super_Element).name);
  NetworkError::NetworkError(this,8,(string *)local_90);
  __cxa_throw(this,&NetworkError::typeinfo,NetworkError::~NetworkError);
}

Assistant:

bool hasConnectedNodes(Network* nw)
{
    int nodeCount = nw->count(Element::NODE);
    vector<char> marked(nodeCount, 0);
    for (Link* link : nw->links)
    {
        marked[link->fromNode->index]++;
        marked[link->toNode->index]++;
    }

    int unmarkedCount = 0;
    for (int i = 0; i < nodeCount; i++)
    {
        try
        {
            if ( !marked[i] )
            {
                unmarkedCount++;
                if ( unmarkedCount <= 10 )
                    throw NetworkError(
                        NetworkError::UNCONNECTED_NODE, nw->node(i)->name);
            }
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
        }
    }
    if ( unmarkedCount > 10 )
    {
        nw->msgLog << "\n\n NETWORK ERROR 233: no links connected to another "
                   << (unmarkedCount - 10) << " nodes ";
    }
    return (unmarkedCount == 0);
}